

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O1

bool ZXing::OneD::DecodeDigit(PatternView *view,string *txt,int *lgPattern)

{
  int iVar1;
  ulong uVar2;
  undefined1 *puVar3;
  int i;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = 0xffffffff;
  if (lgPattern == (int *)0x0) {
    puVar3 = UPCEANCommon::L_PATTERNS;
    uVar4 = 0;
    fVar6 = 0.48;
    do {
      fVar5 = RowReader::PatternMatchVariance<unsigned_short,int>
                        (view->_data,(int *)puVar3,(long)view->_size,0.7);
      if (fVar5 < fVar6) {
        uVar2 = uVar4 & 0xffffffff;
      }
      iVar1 = (int)uVar2;
      if (fVar6 <= fVar5) {
        fVar5 = fVar6;
      }
      uVar4 = uVar4 + 1;
      puVar3 = (undefined1 *)((long)puVar3 + 0x10);
      fVar6 = fVar5;
    } while (uVar4 != 10);
  }
  else {
    puVar3 = UPCEANCommon::L_AND_G_PATTERNS;
    uVar4 = 0;
    fVar6 = 0.48;
    do {
      fVar5 = RowReader::PatternMatchVariance<unsigned_short,int>
                        (view->_data,(int *)puVar3,(long)view->_size,0.7);
      if (fVar5 < fVar6) {
        uVar2 = uVar4 & 0xffffffff;
      }
      iVar1 = (int)uVar2;
      if (fVar6 <= fVar5) {
        fVar5 = fVar6;
      }
      uVar4 = uVar4 + 1;
      puVar3 = (undefined1 *)((long)puVar3 + 0x10);
      fVar6 = fVar5;
    } while (uVar4 != 0x14);
  }
  if (iVar1 != -1) {
    ToDigit<char>(iVar1 % 10);
    std::__cxx11::string::push_back((char)txt);
    if (lgPattern != (int *)0x0) {
      *lgPattern = (uint)(9 < iVar1) + *lgPattern * 2;
    }
  }
  return iVar1 != -1;
}

Assistant:

static bool DecodeDigit(const PatternView& view, std::string& txt, int* lgPattern = nullptr)
{
#if 1
	// These two values are critical for determining how permissive the decoding will be.
	// We've arrived at these values through a lot of trial and error. Setting them any higher
	// lets false positives creep in quickly.
	static constexpr float MAX_AVG_VARIANCE = 0.48f;
	static constexpr float MAX_INDIVIDUAL_VARIANCE = 0.7f;

	int bestMatch =
		lgPattern ? RowReader::DecodeDigit(view, UPCEANCommon::L_AND_G_PATTERNS, MAX_AVG_VARIANCE, MAX_INDIVIDUAL_VARIANCE, false)
				  : RowReader::DecodeDigit(view, UPCEANCommon::L_PATTERNS, MAX_AVG_VARIANCE, MAX_INDIVIDUAL_VARIANCE, false);
	if (bestMatch == -1)
		return false;

	txt += ToDigit(bestMatch % 10);
	if (lgPattern)
		AppendBit(*lgPattern, bestMatch >= 10);

	return true;
#else
	constexpr int CHAR_SUM = 7;
	auto pattern = RowReader::OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(view);

	// remove first and last bit
	pattern = (~pattern >> 1) & 0b11111;

	// clang-format off
/* pattern now contains the central 5 bits of the L/G/R code
 * L/G-codes always start with 1 and end with 0, R-codes are simply
 * inverted L-codes.

		L-Code  G-Code  R-Code
	___________________________________
	0 	00110 	10011 	11001
	1 	01100 	11001 	10011
	2 	01001 	01101 	10110
	3 	11110 	10000 	00001
	4 	10001 	01110 	01110
	5 	11000 	11100 	00111
	6 	10111 	00010 	01000
	7 	11101 	01000 	00010
	8 	11011 	00100 	00100
	9 	00101 	01011 	11010
*/
	constexpr char I = 0xf0; // invalid pattern

	const char digit[] = {I,    I,    0x16, I,    0x18, 0x09, 0x00, I,
                          0x17, 0x02, I,    0x19, 0x01, 0x12, 0x14, I,
                          0x13, 0x04, I,    0x10, I,    I,    I,    0x06,
                          0x05, 0x11, I,    0x08, 0x15, 0x07, 0x03, I};
	// clang-format on

	char d = digit[pattern];
	txt += ToDigit(d & 0xf);
	if (lgPattern)
		AppendBit(*lgPattern, (d >> 4) & 1);

	return d != I;
#endif
}